

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOBase.c
# Opt level: O0

uint32_t FAPOBase_ValidateFormatDefault
                   (FAPOBase *fapo,FAudioWaveFormatEx *pFormat,uint8_t fOverwrite)

{
  uint16_t uVar1;
  uint32_t local_2c;
  uint32_t local_28;
  uint8_t fOverwrite_local;
  FAudioWaveFormatEx *pFormat_local;
  FAPOBase *fapo_local;
  uint32_t local_4;
  
  if ((((pFormat->wFormatTag == 3) && (pFormat->nChannels != 0)) && (pFormat->nChannels < 0x41)) &&
     (((999 < pFormat->nSamplesPerSec && (pFormat->nSamplesPerSec < 0x30d41)) &&
      (pFormat->wBitsPerSample == 0x20)))) {
    local_4 = 0;
  }
  else {
    if (fOverwrite != '\0') {
      pFormat->wFormatTag = 3;
      if (pFormat->nChannels < 0x41) {
        if (pFormat->nChannels == 0) {
          uVar1 = 1;
        }
        else {
          uVar1 = pFormat->nChannels;
        }
      }
      else {
        uVar1 = 0x40;
      }
      pFormat->nChannels = uVar1;
      if (pFormat->nSamplesPerSec < 0x30d41) {
        if (pFormat->nSamplesPerSec < 1000) {
          local_2c = 1000;
        }
        else {
          local_2c = pFormat->nSamplesPerSec;
        }
        local_28 = local_2c;
      }
      else {
        local_28 = 200000;
      }
      pFormat->nSamplesPerSec = local_28;
      pFormat->wBitsPerSample = 0x20;
    }
    local_4 = 0x88970001;
  }
  return local_4;
}

Assistant:

uint32_t FAPOBase_ValidateFormatDefault(
	FAPOBase *fapo,
	FAudioWaveFormatEx *pFormat,
	uint8_t fOverwrite
) {
	if (	pFormat->wFormatTag != FAPOBASE_DEFAULT_FORMAT_TAG ||
		pFormat->nChannels < FAPOBASE_DEFAULT_FORMAT_MIN_CHANNELS ||
		pFormat->nChannels > FAPOBASE_DEFAULT_FORMAT_MAX_CHANNELS ||
		pFormat->nSamplesPerSec < FAPOBASE_DEFAULT_FORMAT_MIN_FRAMERATE ||
		pFormat->nSamplesPerSec > FAPOBASE_DEFAULT_FORMAT_MAX_FRAMERATE ||
		pFormat->wBitsPerSample != FAPOBASE_DEFAULT_FORMAT_BITSPERSAMPLE	)
	{
		if (fOverwrite)
		{
			pFormat->wFormatTag =
				FAPOBASE_DEFAULT_FORMAT_TAG;
			pFormat->nChannels = FAudio_clamp(
				pFormat->nChannels,
				FAPOBASE_DEFAULT_FORMAT_MIN_CHANNELS,
				FAPOBASE_DEFAULT_FORMAT_MAX_CHANNELS
			);
			pFormat->nSamplesPerSec = FAudio_clamp(
				pFormat->nSamplesPerSec,
				FAPOBASE_DEFAULT_FORMAT_MIN_FRAMERATE,
				FAPOBASE_DEFAULT_FORMAT_MAX_FRAMERATE
			);
			pFormat->wBitsPerSample =
				FAPOBASE_DEFAULT_FORMAT_BITSPERSAMPLE;
		}
		return FAPO_E_FORMAT_UNSUPPORTED;
	}
	return 0;
}